

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,C cRt)

{
  bool bVar1;
  Relations *pRVar2;
  bitset<12UL> bVar3;
  long in_RDX;
  undefined8 in_RSI;
  initializer_list<dg::vr::Relations::Type> *in_RDI;
  Relations relsBound;
  Relations relsLt;
  C boundLt;
  Type rel;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<dg::vr::Relations::Type> *__range2;
  undefined8 uVar4;
  Type type;
  _Base_bitset<1UL> in_stack_ffffffffffffff58;
  C in_stack_ffffffffffffff60;
  C in_stack_ffffffffffffff68;
  undefined1 local_90 [8];
  _WordT local_88;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_80;
  Relations local_70;
  long local_68;
  Type local_5c;
  const_iterator local_58;
  const_iterator local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 uVar5;
  undefined4 uVar6;
  ValueRelations *this_00;
  _Base_bitset<1UL> rels;
  _Base_bitset<1UL> local_8;
  
  if (in_RDX == 0) {
    memset(&stack0xfffffffffffffff8,0,8);
    Relations::Relations((Relations *)0x208698);
  }
  else {
    local_48 = 2;
    local_44 = 4;
    uVar5 = 6;
    uVar6 = 8;
    this_00 = (ValueRelations *)&stack0xffffffffffffffb8;
    rels._M_w = 4;
    local_50 = std::initializer_list<dg::vr::Relations::Type>::begin
                         ((initializer_list<dg::vr::Relations::Type> *)&stack0xffffffffffffffc8);
    local_58 = std::initializer_list<dg::vr::Relations::Type>::end(in_RDI);
    for (; local_50 != local_58; local_50 = local_50 + 1) {
      local_5c = *local_50;
      Relations::Relations((Relations *)0x20872f);
      uVar4 = in_RSI;
      memset(local_90,0,8);
      Relations::Relations((Relations *)0x208756);
      pRVar2 = Relations::set((Relations *)in_RDI,(Type)((ulong)uVar4 >> 0x20),
                              SUB81((ulong)uVar4 >> 0x18,0));
      type = (Type)((ulong)uVar4 >> 0x20);
      local_88 = (pRVar2->bits).super__Base_bitset<1UL>._M_w;
      local_80 = getBound(this_00,(Handle)CONCAT44(uVar6,uVar5),(Relations)rels._M_w);
      std::tie<llvm::ConstantInt_const*,dg::vr::Relations>
                ((ConstantInt **)in_stack_ffffffffffffff58._M_w,(Relations *)in_RDI);
      std::tuple<llvm::ConstantInt_const*&,dg::vr::Relations&>::operator=
                ((tuple<const_llvm::ConstantInt_*&,_dg::vr::Relations_&> *)in_stack_ffffffffffffff60
                 ,(pair<const_llvm::ConstantInt_*,_dg::vr::Relations> *)
                  in_stack_ffffffffffffff58._M_w);
      if (local_68 != 0) {
        in_stack_ffffffffffffff58._M_w =
             (_WordT)compare(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        bVar1 = Relations::has((Relations *)in_RDI,type);
        if (bVar1) {
          bVar3.super__Base_bitset<1UL>._M_w =
               (_Base_bitset<1UL>)dg::vr::compose(&local_70,(Relations *)&stack0xffffffffffffff58);
          return (Relations)(_WordT)bVar3.super__Base_bitset<1UL>._M_w;
        }
      }
    }
    memset(&stack0xfffffffffffffff8,0,8);
    Relations::Relations((Relations *)0x208835);
  }
  return (Relations)local_8._M_w;
}

Assistant:

Relations ValueRelations::_between(Handle lt, C cRt) const {
    if (!cRt)
        return {};

    for (Relations::Type rel :
         {Relations::SLE, Relations::ULE, Relations::SGE, Relations::UGE}) {
        C boundLt;
        Relations relsLt;
        std::tie(boundLt, relsLt) = getBound(lt, Relations().set(rel));

        if (!boundLt)
            continue;

        Relations relsBound = compare(boundLt, cRt);
        // lt <= boundLt <= cRt || lt >= boundLt >= cRt
        if (relsBound.has(rel))
            return compose(relsLt, relsBound);
    }
    return {};
}